

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

LogicalType *
duckdb::LogicalType::VARCHAR_COLLATION(LogicalType *__return_storage_ptr__,string *collation)

{
  shared_ptr<duckdb::ExtraTypeInfo,_true> local_38;
  shared_ptr<duckdb::StringTypeInfo,_true> string_info;
  
  make_shared_ptr<duckdb::StringTypeInfo,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&string_info);
  local_38.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &(string_info.internal.super___shared_ptr<duckdb::StringTypeInfo,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->super_ExtraTypeInfo;
  local_38.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       string_info.internal.super___shared_ptr<duckdb::StringTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  string_info.internal.super___shared_ptr<duckdb::StringTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  string_info.internal.super___shared_ptr<duckdb::StringTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LogicalType(__return_storage_ptr__,VARCHAR,&local_38);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &string_info.internal.
              super___shared_ptr<duckdb::StringTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

LogicalType LogicalType::VARCHAR_COLLATION(string collation) { // NOLINT
	auto string_info = make_shared_ptr<StringTypeInfo>(std::move(collation));
	return LogicalType(LogicalTypeId::VARCHAR, std::move(string_info));
}